

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaD_call(lua_State *L,StkId func,int nResults)

{
  double dVar1;
  undefined8 uVar2;
  byte bVar3;
  undefined2 uVar4;
  GCObject *pGVar5;
  global_State *pgVar6;
  global_State *pgVar7;
  Value *pVVar8;
  CallInfo *pCVar9;
  Table *events;
  double dVar10;
  double dVar11;
  TMS op;
  ushort uVar12;
  int iVar13;
  int iVar14;
  GCObject *pGVar15;
  GCObject *pGVar16;
  GCObject *pGVar17;
  TValue *pTVar18;
  TValue *pTVar19;
  TValue *t2;
  TValue *pTVar20;
  StkId pTVar21;
  ulong uVar22;
  StkId pTVar23;
  long lVar24;
  uint uVar25;
  TValue *val;
  Table *pTVar26;
  long *plVar27;
  char *fmt;
  uint *puVar28;
  uint *puVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  TValue *i_o;
  int *piVar33;
  StkId pTVar34;
  bool bVar35;
  lua_Number lVar36;
  int local_5c;
  TValue g;
  
  uVar4 = L->nCcalls;
  uVar12 = uVar4 + 1;
  L->nCcalls = uVar12;
  if (199 < uVar12) {
    if (uVar12 == 200) {
      fmt = "C stack overflow";
LAB_00106363:
      luaG_runerror(L,fmt);
    }
    if (0xe0 < uVar12) {
      luaD_throw(L,5);
    }
  }
  iVar13 = luaD_precall(L,func,nResults);
  if (iVar13 != 0) {
LAB_001050b6:
    L->nCcalls = L->nCcalls - 1;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
      return;
    }
    return;
  }
  local_5c = 1;
LAB_0010510c:
  pTVar21 = L->base;
  pGVar5 = (L->ci->func->value).gc;
  pTVar34 = (StkId)((pGVar5->th).l_G)->frealloc;
  puVar29 = L->savedpc;
LAB_00105130:
  do {
    puVar28 = puVar29;
    puVar29 = puVar28 + 1;
    uVar30 = *puVar28;
  } while (0x25 < (uVar30 & 0x3f));
  uVar25 = uVar30 >> 6 & 0xff;
  pTVar20 = (TValue *)((long)&pTVar21->value + (ulong)(uVar25 << 4));
  switch(uVar30 & 0x3f) {
  case 0:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    pTVar20->value = *(Value *)((long)&pTVar21->value + uVar32);
    pTVar20->tt = *(int *)((long)&pTVar21->tt + uVar32);
    goto LAB_00105130;
  case 1:
    uVar32 = (ulong)(uVar30 >> 10 & 0xfffffff0);
    pTVar20->value = *(Value *)((long)&pTVar34->value + uVar32);
    pTVar20->tt = *(int *)((long)&pTVar34->tt + uVar32);
    goto LAB_00105130;
  case 2:
    (pTVar20->value).b = uVar30 >> 0x17;
    pTVar20->tt = 1;
    if ((uVar30 & 0x7fc000) != 0) {
      puVar29 = puVar28 + 2;
    }
    goto LAB_00105130;
  case 3:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    do {
      pTVar18->tt = 0;
      pTVar18 = pTVar18 + -1;
    } while (pTVar20 <= pTVar18);
    goto LAB_00105130;
  case 4:
    pVVar8 = *(Value **)(*(long *)((long)pGVar5 + (ulong)(uVar30 >> 0x17) * 8 + 0x28) + 0x10);
    pTVar20->value = *pVVar8;
    pTVar20->tt = pVVar8[1].b;
    goto LAB_00105130;
  case 5:
    pTVar19 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 10 & 0xfffffff0));
    g.value = (Value)(pGVar5->h).array;
    pTVar18 = &g;
    g.tt = 5;
    L->savedpc = puVar29;
    goto LAB_00105a11;
  case 6:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    goto LAB_001059f5;
  case 7:
    g.value = (Value)(pGVar5->h).array;
    pTVar19 = &g;
    g.tt = 5;
    L->savedpc = puVar29;
    pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 10 & 0xfffffff0));
    pTVar21 = pTVar20;
    goto LAB_001056b6;
  case 8:
    pGVar17 = *(GCObject **)((long)pGVar5 + (ulong)(uVar30 >> 0x17) * 8 + 0x28);
    pTVar18 = (pGVar17->p).k;
    pTVar18->value = pTVar20->value;
    iVar13 = pTVar20->tt;
    pTVar18->tt = iVar13;
    if (((3 < iVar13) && (((((pTVar20->value).gc)->gch).marked & 3) != 0)) &&
       (((pGVar17->gch).marked & 4) != 0)) {
      luaC_barrierf(L,pGVar17,(pTVar20->value).gc);
    }
    goto LAB_00105130;
  case 9:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    if ((uVar30 >> 0x16 & 1) != 0) {
      pTVar21 = pTVar34;
    }
    L->savedpc = puVar29;
    pTVar21 = (StkId)((long)&pTVar21->value + (ulong)(uVar30 >> 10 & 0xff0));
    pTVar19 = pTVar20;
LAB_001056b6:
    luaV_settable(L,pTVar19,pTVar18,pTVar21);
    goto LAB_00105e88;
  case 10:
    iVar13 = luaO_fb2int(uVar30 >> 0x17);
    iVar14 = luaO_fb2int(uVar30 >> 0xe & 0x1ff);
    pGVar17 = (GCObject *)luaH_new(L,iVar13,iVar14);
    (pTVar20->value).gc = pGVar17;
    pTVar20->tt = 5;
    L->savedpc = puVar29;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    goto LAB_00105e88;
  case 0xb:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    pTVar20[1].value = *(Value *)((long)&pTVar21->value + uVar32);
    pTVar20[1].tt = *(int *)((long)&pTVar21->tt + uVar32);
LAB_001059f5:
    pTVar18 = (TValue *)((long)&pTVar21->value + uVar32);
    if ((uVar30 >> 0x16 & 1) != 0) {
      pTVar21 = pTVar34;
    }
    L->savedpc = puVar29;
    pTVar19 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 10 & 0xff0));
LAB_00105a11:
    luaV_gettable(L,pTVar18,pTVar19,pTVar20);
    goto LAB_00105e88;
  case 0xc:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    pTVar23 = pTVar34;
    if ((uVar30 >> 0x16 & 1) == 0) {
      pTVar23 = pTVar21;
    }
    pTVar19 = (TValue *)((long)&pTVar23->value + (ulong)(uVar30 >> 10 & 0xff0));
    if ((pTVar18->tt == 3) && (pTVar19->tt == 3)) {
      dVar11 = (pTVar18->value).n + (pTVar19->value).n;
LAB_001059d7:
      (pTVar20->value).n = dVar11;
      pTVar20->tt = 3;
      goto LAB_00105130;
    }
    L->savedpc = puVar29;
    op = TM_ADD;
    break;
  case 0xd:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    pTVar23 = pTVar34;
    if ((uVar30 >> 0x16 & 1) == 0) {
      pTVar23 = pTVar21;
    }
    pTVar19 = (TValue *)((long)&pTVar23->value + (ulong)(uVar30 >> 10 & 0xff0));
    if ((pTVar18->tt == 3) && (pTVar19->tt == 3)) {
      dVar11 = (pTVar18->value).n - (pTVar19->value).n;
      goto LAB_001059d7;
    }
    L->savedpc = puVar29;
    op = TM_SUB;
    break;
  case 0xe:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    pTVar23 = pTVar34;
    if ((uVar30 >> 0x16 & 1) == 0) {
      pTVar23 = pTVar21;
    }
    pTVar19 = (TValue *)((long)&pTVar23->value + (ulong)(uVar30 >> 10 & 0xff0));
    if ((pTVar18->tt == 3) && (pTVar19->tt == 3)) {
      dVar11 = (pTVar18->value).n * (pTVar19->value).n;
      goto LAB_001059d7;
    }
    L->savedpc = puVar29;
    op = TM_MUL;
    break;
  case 0xf:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    pTVar23 = pTVar34;
    if ((uVar30 >> 0x16 & 1) == 0) {
      pTVar23 = pTVar21;
    }
    pTVar19 = (TValue *)((long)&pTVar23->value + (ulong)(uVar30 >> 10 & 0xff0));
    if ((pTVar18->tt == 3) && (pTVar19->tt == 3)) {
      dVar11 = (pTVar18->value).n / (pTVar19->value).n;
      goto LAB_001059d7;
    }
    L->savedpc = puVar29;
    op = TM_DIV;
    break;
  case 0x10:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    pTVar23 = pTVar34;
    if ((uVar30 >> 0x16 & 1) == 0) {
      pTVar23 = pTVar21;
    }
    pTVar19 = (TValue *)((long)&pTVar23->value + (ulong)(uVar30 >> 10 & 0xff0));
    if ((pTVar18->tt == 3) && (pTVar19->tt == 3)) {
      dVar11 = (pTVar18->value).n;
      dVar1 = (pTVar19->value).n;
      dVar10 = floor(dVar11 / dVar1);
      lVar36 = dVar11 - dVar10 * dVar1;
LAB_00106024:
      (pTVar20->value).n = lVar36;
      pTVar20->tt = 3;
      goto LAB_00105130;
    }
    L->savedpc = puVar29;
    op = TM_MOD;
    break;
  case 0x11:
    pTVar18 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar18 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    pTVar23 = pTVar34;
    if ((uVar30 >> 0x16 & 1) == 0) {
      pTVar23 = pTVar21;
    }
    pTVar19 = (TValue *)((long)&pTVar23->value + (ulong)(uVar30 >> 10 & 0xff0));
    if ((pTVar18->tt == 3) && (pTVar19->tt == 3)) {
      dVar11 = pow((pTVar18->value).n,(pTVar19->value).n);
      goto LAB_001059d7;
    }
    L->savedpc = puVar29;
    op = TM_POW;
    break;
  case 0x12:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    pTVar18 = (TValue *)((long)&pTVar21->value + uVar32);
    if (*(int *)((long)&pTVar21->tt + uVar32) != 3) {
      L->savedpc = puVar29;
      Arith(L,pTVar20,pTVar18,pTVar18,TM_UNM);
      goto LAB_00105e88;
    }
    (pTVar20->value).gc = (GCObject *)((ulong)(pTVar18->value).gc ^ 0x8000000000000000);
    pTVar20->tt = 3;
    goto LAB_00105130;
  case 0x13:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    iVar13 = *(int *)((long)&pTVar21->tt + uVar32);
    if (iVar13 == 0) {
      uVar30 = 1;
    }
    else if (iVar13 == 1) {
      uVar30 = (uint)(*(int *)((long)&pTVar21->value + uVar32) == 0);
    }
    else {
      uVar30 = 0;
    }
    *(uint *)&pTVar20->value = uVar30;
    pTVar20->tt = 1;
    goto LAB_00105130;
  case 0x14:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    pTVar18 = (TValue *)((long)&pTVar21->value + uVar32);
    iVar13 = *(int *)((long)&pTVar21->tt + uVar32);
    if (iVar13 == 4) {
      uVar2 = *(undefined8 *)((long)(pTVar18->value).gc + 0x10);
      lVar36 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar2 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      goto LAB_00106024;
    }
    if (iVar13 == 5) {
      iVar13 = luaH_getn(&((pTVar18->value).gc)->h);
      dVar11 = (double)iVar13;
      goto LAB_001059d7;
    }
    L->savedpc = puVar29;
    iVar13 = call_binTM(L,pTVar18,&luaO_nilobject_,pTVar20,TM_LEN);
    if (iVar13 == 0) {
      luaG_typeerror(L,pTVar18,"get length of");
    }
    goto LAB_0010605e;
  case 0x15:
    uVar31 = uVar30 >> 0xe & 0x1ff;
    L->savedpc = puVar29;
    luaV_concat(L,(uVar31 - (uVar30 >> 0x17)) + 1,uVar31);
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    pTVar21 = L->base;
    uVar32 = (ulong)((uVar30 >> 0x17) << 4);
    *(undefined8 *)((long)&pTVar21->value + (ulong)(uVar25 << 4)) =
         *(undefined8 *)((long)&pTVar21->value + uVar32);
    *(undefined4 *)((long)&pTVar21->tt + (ulong)(uVar25 << 4)) =
         *(undefined4 *)((long)&pTVar21->tt + uVar32);
    goto LAB_00105130;
  case 0x16:
    goto switchD_0010515f_caseD_16;
  case 0x17:
    pTVar20 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar20 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    if ((uVar30 >> 0x16 & 1) != 0) {
      pTVar21 = pTVar34;
    }
    uVar32 = (ulong)(uVar30 >> 10 & 0xff0);
    L->savedpc = puVar29;
    if (pTVar20->tt != *(int *)((long)&pTVar21->tt + uVar32)) goto LAB_00105e91;
    pTVar18 = (TValue *)((long)&pTVar21->value + uVar32);
    uVar30 = 1;
    switch(pTVar20->tt) {
    case 0:
      break;
    case 1:
      bVar35 = (pTVar20->value).b == (pTVar18->value).b;
      goto LAB_001061c9;
    default:
      bVar35 = (pTVar20->value).gc == (pTVar18->value).gc;
LAB_001061c9:
      uVar30 = (uint)bVar35;
      break;
    case 3:
      uVar30 = -(uint)((pTVar18->value).n == (pTVar20->value).n) & 1;
      break;
    case 5:
    case 7:
      if ((pTVar20->value).gc != (pTVar18->value).gc) {
        pTVar26 = (((pTVar20->value).gc)->h).metatable;
        if ((pTVar26 == (Table *)0x0) || ((pTVar26->flags & 0x10) != 0)) goto LAB_00105e91;
        events = (((pTVar18->value).gc)->h).metatable;
        pTVar19 = luaT_gettm(pTVar26,TM_EQ,L->l_G->tmname[4]);
        if (pTVar19 != (TValue *)0x0) {
          if (pTVar26 != events) {
            if ((events != (Table *)0x0) && ((events->flags & 0x10) == 0)) {
              t2 = luaT_gettm(events,TM_EQ,L->l_G->tmname[4]);
              if (t2 == (TValue *)0x0) goto LAB_00106222;
              iVar13 = luaO_rawequalObj(pTVar19,t2);
              if (iVar13 != 0) goto LAB_00105d0a;
            }
LAB_00105e91:
            uVar30 = 0;
            break;
          }
LAB_00105d0a:
          callTMres(L,L->top,pTVar19,pTVar20,pTVar18);
          iVar13 = L->top->tt;
          if (iVar13 != 0) {
            if (iVar13 == 1) {
              uVar30 = (uint)((L->top->value).b != 0);
            }
            break;
          }
        }
LAB_00106222:
        uVar30 = 0;
      }
    }
joined_r0x00106202:
    if (uVar30 == uVar25) {
      puVar29 = puVar29 + ((ulong)(*puVar29 >> 0xe) - 0x1ffff);
    }
LAB_00106215:
    pTVar21 = L->base;
    goto LAB_00106219;
  case 0x18:
    pTVar20 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar20 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    if ((uVar30 >> 0x16 & 1) != 0) {
      pTVar21 = pTVar34;
    }
    L->savedpc = puVar29;
    uVar30 = luaV_lessthan(L,pTVar20,
                           (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 10 & 0xff0)));
    if (uVar30 == uVar25) {
      puVar29 = puVar29 + ((ulong)(*puVar29 >> 0xe) - 0x1ffff);
    }
    goto LAB_00106215;
  case 0x19:
    L->savedpc = puVar29;
    pTVar20 = (TValue *)((long)&pTVar21->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    if ((int)uVar30 < 0) {
      pTVar20 = (TValue *)((long)&pTVar34->value + (ulong)(uVar30 >> 0x13 & 0xff0));
    }
    if ((uVar30 >> 0x16 & 1) != 0) {
      pTVar21 = pTVar34;
    }
    uVar32 = (ulong)(uVar30 >> 10 & 0xff0);
    pTVar18 = (TValue *)((long)&pTVar21->value + uVar32);
    iVar13 = pTVar20->tt;
    if (iVar13 == *(int *)((long)&pTVar21->tt + uVar32)) {
      if (iVar13 == 4) {
        iVar13 = l_strcmp(&((pTVar20->value).gc)->ts,&((pTVar18->value).gc)->ts);
        uVar30 = (uint)(iVar13 < 1);
      }
      else if (iVar13 == 3) {
        uVar30 = (uint)((pTVar20->value).n <= (pTVar18->value).n);
      }
      else {
        uVar30 = call_orderTM(L,pTVar20,pTVar18,TM_LE);
        if (uVar30 == 0xffffffff) {
          iVar13 = call_orderTM(L,pTVar18,pTVar20,TM_LT);
          if (iVar13 == -1) {
            luaG_ordererror(L,pTVar20,pTVar18);
            uVar30 = 0;
          }
          else {
            uVar30 = (uint)(iVar13 == 0);
          }
        }
      }
    }
    else {
      luaG_ordererror(L,pTVar20,pTVar18);
      uVar30 = 0;
    }
    goto joined_r0x00106202;
  case 0x1a:
    if (pTVar20->tt == 0) {
      uVar25 = 1;
    }
    else if (pTVar20->tt == 1) {
      uVar25 = (uint)((pTVar20->value).b == 0);
    }
    else {
      uVar25 = 0;
    }
    if (uVar25 != (uVar30 >> 0xe & 0x1ff)) {
LAB_0010609c:
      puVar29 = puVar29 + ((ulong)(*puVar29 >> 0xe) - 0x1ffff);
    }
    goto LAB_00106219;
  case 0x1b:
    uVar32 = (ulong)(uVar30 >> 0x13 & 0xfffffff0);
    pVVar8 = (Value *)((long)&pTVar21->value + uVar32);
    iVar13 = *(int *)((long)&pTVar21->tt + uVar32);
    if (iVar13 == 0) {
      uVar25 = 1;
    }
    else {
      uVar25 = 0;
      if (iVar13 == 1) {
        uVar25 = (uint)(pVVar8->b == 0);
      }
    }
    if (uVar25 != (uVar30 >> 0xe & 0x1ff)) {
      pTVar20->value = *pVVar8;
      pTVar20->tt = iVar13;
      goto LAB_0010609c;
    }
    goto LAB_00106219;
  case 0x1c:
    if (0x7fffff < uVar30) {
      L->top = (StkId)((long)&pTVar20->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    }
    uVar30 = uVar30 >> 0xe & 0x1ff;
    L->savedpc = puVar29;
    iVar13 = luaD_precall(L,pTVar20,uVar30 - 1);
    if (iVar13 != 1) {
      if (iVar13 != 0) goto LAB_001050b6;
      local_5c = local_5c + 1;
      goto LAB_0010510c;
    }
    if (uVar30 != 0) {
      L->top = L->ci->top;
    }
    pTVar21 = L->base;
    goto LAB_00105130;
  case 0x1d:
    if (0x7fffff < uVar30) {
      L->top = (StkId)((long)&pTVar20->value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
    }
    L->savedpc = puVar29;
    iVar13 = luaD_precall(L,pTVar20,-1);
    if (iVar13 == 1) {
LAB_0010605e:
      pTVar21 = L->base;
      goto LAB_00105130;
    }
    if (iVar13 != 0) goto LAB_001050b6;
    pCVar9 = L->ci;
    pTVar21 = pCVar9[-1].func;
    pTVar34 = pCVar9->func;
    pTVar23 = pTVar21;
    if (L->openupval != (GCObject *)0x0) {
      luaF_close(L,pCVar9[-1].base);
      pTVar23 = pCVar9[-1].func;
    }
    pTVar23 = (StkId)(((long)pCVar9->base - (long)pTVar34) + (long)pTVar23);
    pCVar9[-1].base = pTVar23;
    L->base = pTVar23;
    for (; pTVar34 < L->top; pTVar34 = pTVar34 + 1) {
      pTVar21->value = pTVar34->value;
      pTVar21->tt = pTVar34->tt;
      pTVar21 = pTVar21 + 1;
    }
    L->top = pTVar21;
    pCVar9[-1].top = pTVar21;
    pCVar9[-1].savedpc = L->savedpc;
    pCVar9[-1].tailcalls = pCVar9[-1].tailcalls + 1;
    L->ci = L->ci + -1;
    goto LAB_0010510c;
  case 0x1e:
    goto switchD_0010515f_caseD_1e;
  case 0x1f:
    dVar11 = (pTVar20->value).n + pTVar20[2].value.n;
    if (pTVar20[2].value.n <= 0.0) {
      if (dVar11 < pTVar20[1].value.n) goto LAB_00105130;
    }
    else if (pTVar20[1].value.n < dVar11) goto LAB_00105130;
    (pTVar20->value).n = dVar11;
    pTVar20->tt = 3;
    pTVar20[3].value.n = dVar11;
    pTVar20[3].tt = 3;
    puVar29 = puVar29 + ((ulong)(uVar30 >> 0xe) - 0x1ffff);
    goto LAB_00105130;
  case 0x20:
    L->savedpc = puVar29;
    if ((pTVar20->tt != 3) && (pTVar18 = luaV_tonumber(pTVar20,pTVar20), pTVar18 == (TValue *)0x0))
    {
      fmt = "\'for\' initial value must be a number";
      goto LAB_00106363;
    }
    if ((pTVar20[1].tt != 3) &&
       (pTVar18 = luaV_tonumber(pTVar20 + 1,pTVar20 + 1), pTVar18 == (TValue *)0x0)) {
      fmt = "\'for\' limit must be a number";
      goto LAB_00106363;
    }
    pTVar18 = pTVar20 + 2;
    if ((pTVar20[2].tt != 3) && (pTVar18 = luaV_tonumber(pTVar18,pTVar18), pTVar18 == (TValue *)0x0)
       ) {
      fmt = "\'for\' step must be a number";
      goto LAB_00106363;
    }
    (pTVar20->value).n = (pTVar20->value).n - (pTVar18->value).n;
    pTVar20->tt = 3;
switchD_0010515f_caseD_16:
    puVar29 = puVar29 + ((ulong)(uVar30 >> 0xe) - 0x1ffff);
    goto LAB_00105130;
  case 0x21:
    pTVar20[5].value = pTVar20[2].value;
    pTVar20[5].tt = pTVar20[2].tt;
    pTVar20[4].value = pTVar20[1].value;
    pTVar20[4].tt = pTVar20[1].tt;
    pTVar20[3].value = pTVar20->value;
    pTVar20[3].tt = pTVar20->tt;
    L->top = pTVar20 + 6;
    L->savedpc = puVar29;
    luaD_call(L,pTVar20 + 3,uVar30 >> 0xe & 0x1ff);
    pTVar21 = L->base;
    L->top = L->ci->top;
    uVar32 = (ulong)(uVar25 << 4);
    iVar13 = *(int *)((long)&pTVar21[3].tt + uVar32);
    if (iVar13 != 0) {
      *(undefined8 *)((long)&pTVar21[2].value + uVar32) =
           *(undefined8 *)((long)&pTVar21[3].value + uVar32);
      *(int *)((long)&pTVar21[2].tt + uVar32) = iVar13;
      puVar29 = puVar29 + ((ulong)(*puVar29 >> 0xe) - 0x1ffff);
    }
LAB_00106219:
    puVar29 = puVar29 + 1;
    goto LAB_00105130;
  case 0x22:
    if (uVar30 < 0x800000) {
      uVar31 = (int)((ulong)((long)L->top - (long)pTVar20) >> 4) - 1;
      L->top = L->ci->top;
    }
    else {
      uVar31 = uVar30 >> 0x17;
    }
    uVar32 = (ulong)uVar31;
    uVar30 = uVar30 >> 0xe & 0x1ff;
    if (uVar30 == 0) {
      uVar30 = puVar28[1];
      puVar29 = puVar28 + 2;
    }
    if (pTVar20->tt == 5) {
      pGVar17 = (pTVar20->value).gc;
      iVar13 = uVar30 * 0x32 + uVar31 + -0x32;
      if ((pGVar17->h).sizearray < iVar13) {
        if ((pGVar17->h).node == &dummynode_) {
          iVar14 = 0;
        }
        else {
          iVar14 = (int)(1L << ((pGVar17->h).lsizenode & 0x3f));
        }
        resize(L,&pGVar17->h,iVar13,iVar14);
      }
      plVar27 = (long *)((long)&pTVar21[uVar32].value + (ulong)(uVar25 << 4));
      while (iVar13 = (int)uVar32, 0 < iVar13) {
        pTVar20 = luaH_setnum(L,&pGVar17->h,uVar30 * 0x32 + -0x32 + iVar13);
        (pTVar20->value).gc = (GCObject *)*plVar27;
        lVar24 = plVar27[1];
        pTVar20->tt = (int)lVar24;
        if (((3 < (int)lVar24) && ((*(byte *)(*plVar27 + 9) & 3) != 0)) &&
           (((pGVar17->gch).marked & 4) != 0)) {
          pgVar6 = L->l_G;
          (pGVar17->gch).marked = (pGVar17->gch).marked & 0xfb;
          (pGVar17->h).gclist = pgVar6->grayagain;
          pgVar6->grayagain = pGVar17;
        }
        plVar27 = plVar27 + -2;
        uVar32 = (ulong)(iVar13 - 1);
      }
    }
    goto LAB_00105130;
  case 0x23:
    luaF_close(L,pTVar20);
    goto LAB_00105130;
  case 0x24:
    pGVar17 = (&(((((pGVar5->h).node)->i_key).nk.next)->i_val).value)[uVar30 >> 0xe].gc;
    bVar3 = (pGVar17->p).nups;
    pGVar15 = (GCObject *)luaF_newLclosure(L,(uint)bVar3,(Table *)(pGVar5->h).array);
    (pGVar15->th).l_G = (global_State *)pGVar17;
    for (uVar32 = 0; uVar32 != bVar3; uVar32 = uVar32 + 1) {
      uVar30 = *puVar29 >> 0x17;
      if ((*puVar29 & 0x3f) == 4) {
        pGVar16 = *(GCObject **)((long)pGVar5 + (ulong)uVar30 * 8 + 0x28);
      }
      else {
        pTVar26 = (Table *)((long)&pTVar21->value + (ulong)(uVar30 << 4));
        pgVar6 = L->l_G;
        pGVar17 = (GCObject *)&L->openupval;
        do {
          pGVar16 = (pGVar17->gch).next;
          if ((pGVar16 == (GCObject *)0x0) || ((pGVar16->h).metatable < pTVar26)) {
            pGVar16 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x28);
            (pGVar16->gch).tt = '\n';
            (pGVar16->gch).marked = pgVar6->currentwhite & 3;
            (pGVar16->h).metatable = pTVar26;
            (pGVar16->gch).next = (pGVar17->gch).next;
            (pGVar17->gch).next = pGVar16;
            (pGVar16->h).array = (TValue *)&pgVar6->uvhead;
            pgVar7 = (global_State *)(pgVar6->uvhead).u.l.next;
            (pGVar16->th).l_G = pgVar7;
            pgVar7->ud = pGVar16;
            (pgVar6->uvhead).u.l.next = (UpVal *)pGVar16;
            goto LAB_00105297;
          }
          pGVar17 = pGVar16;
        } while ((pGVar16->h).metatable != pTVar26);
        if ((~pgVar6->currentwhite & (pGVar16->gch).marked & 3) != 0) {
          (pGVar16->gch).marked = (pGVar16->gch).marked ^ 3;
        }
      }
LAB_00105297:
      *(GCObject **)((long)pGVar15 + uVar32 * 8 + 0x28) = pGVar16;
      puVar29 = puVar29 + 1;
    }
    (pTVar20->value).gc = pGVar15;
    pTVar20->tt = 6;
    L->savedpc = puVar29;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    pTVar21 = L->base;
    goto LAB_00105130;
  case 0x25:
    goto switchD_0010515f_caseD_25;
  }
  Arith(L,pTVar20,pTVar18,pTVar19,op);
LAB_00105e88:
  pTVar21 = L->base;
  goto LAB_00105130;
switchD_0010515f_caseD_25:
  pCVar9 = L->ci;
  uVar31 = ~(uint)*(byte *)((long)&((pGVar5->th).l_G)->GCthreshold + 1) +
           (int)((ulong)((long)pCVar9->base - (long)pCVar9->func) >> 4);
  if (uVar30 < 0x800000) {
    L->savedpc = puVar29;
    if ((long)L->stack_last - (long)L->top <= (long)(int)(uVar31 * 0x10)) {
      luaD_growstack(L,uVar31);
    }
    pTVar21 = L->base;
    pTVar20 = (TValue *)((long)&pTVar21->value + (ulong)(uVar25 << 4));
    L->top = pTVar20 + (int)uVar31;
    uVar30 = uVar31;
  }
  else {
    uVar30 = (uVar30 >> 0x17) - 1;
  }
  uVar22 = 0;
  uVar32 = (ulong)uVar30;
  if ((int)uVar30 < 1) {
    uVar32 = uVar22;
  }
  lVar24 = (long)(int)uVar31 * -0x10;
  piVar33 = &pTVar20->tt;
  for (; uVar32 != uVar22; uVar22 = uVar22 + 1) {
    if ((long)uVar22 < (long)(int)uVar31) {
      pTVar23 = pCVar9->base;
      ((TValue *)(piVar33 + -2))->value = *(Value *)((long)&pTVar23->value + lVar24);
      *piVar33 = *(int *)((long)&pTVar23->tt + lVar24);
    }
    else {
      *piVar33 = 0;
    }
    lVar24 = lVar24 + 0x10;
    piVar33 = piVar33 + 4;
  }
  goto LAB_00105130;
switchD_0010515f_caseD_1e:
  if (0x7fffff < uVar30) {
    L->top = (StkId)((long)&pTVar20[-1].value + (ulong)(uVar30 >> 0x13 & 0xfffffff0));
  }
  if (L->openupval != (GCObject *)0x0) {
    luaF_close(L,pTVar21);
  }
  L->savedpc = puVar29;
  iVar13 = luaD_poscall(L,pTVar20);
  local_5c = local_5c + -1;
  if (local_5c == 0) goto LAB_001050b6;
  if (iVar13 != 0) {
    L->top = L->ci->top;
  }
  goto LAB_0010510c;
}

Assistant:

static void luaD_call(lua_State*L,StkId func,int nResults){
if(++L->nCcalls>=200){
if(L->nCcalls==200)
luaG_runerror(L,"C stack overflow");
else if(L->nCcalls>=(200+(200>>3)))
luaD_throw(L,5);
}
if(luaD_precall(L,func,nResults)==0)
luaV_execute(L,1);
L->nCcalls--;
luaC_checkGC(L);
}